

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase827::run(TestCase827 *this)

{
  Reader value;
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_1;
  Builder local_1f0;
  char *local_1d8;
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> old;
  PointerBuilder local_1a8;
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> newVersion;
  Orphan<capnproto_test::capnp::test::TestNewVersion> orphan;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&old,&builder.super_MessageBuilder);
  _kjCondition_1.right.content.ptr = (char *)old._builder.data;
  _kjCondition_1.left = (char (*) [4])old._builder.segment;
  _kjCondition_1.right._0_8_ = old._builder.capTable;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition_1,(StructSize)0x10000);
  _kjCondition_1.left = (char (*) [4])root._builder.segment;
  _kjCondition_1.right._0_8_ = root._builder.capTable;
  _kjCondition_1.right.content.ptr = (char *)root._builder.pointers;
  PointerBuilder::initStruct(&old._builder,(PointerBuilder *)&_kjCondition_1,(StructSize)0x20001);
  *(undefined8 *)old._builder.data = 0x4d2;
  _kjCondition_1.left = (char (*) [4])old._builder.segment;
  _kjCondition_1.right._0_8_ = old._builder.capTable;
  _kjCondition_1.right.content.ptr = (char *)old._builder.pointers;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&_kjCondition_1,value);
  newVersion._builder.segment = root._builder.segment;
  newVersion._builder.capTable = root._builder.capTable;
  newVersion._builder.data = root._builder.pointers;
  PointerBuilder::disown((OrphanBuilder *)&_kjCondition_1,(PointerBuilder *)&newVersion);
  orphan.builder.capTable = (CapTableBuilder *)_kjCondition_1.right.content.ptr;
  orphan.builder.location = (word *)_kjCondition_1.right.content.size_;
  orphan.builder.tag.content = (uint64_t)_kjCondition_1.left;
  orphan.builder.segment = (SegmentBuilder *)_kjCondition_1.right._0_8_;
  *(undefined8 *)old._builder.data = 0x3039;
  OrphanBuilder::asStructReader((StructReader *)&_kjCondition_1,&orphan.builder,(StructSize)0x30002)
  ;
  if ((uint)_kjCondition_1.op.content.ptr < 0x40) {
    newVersion._builder.capTable = (CapTableBuilder *)0x0;
  }
  else {
    newVersion._builder.capTable = *(CapTableBuilder **)_kjCondition_1.right.content.ptr;
  }
  newVersion._builder.segment = (SegmentBuilder *)CONCAT44(newVersion._builder.segment._4_4_,0x3039)
  ;
  newVersion._builder.data = anon_var_dwarf_a9f8;
  newVersion._builder.pointers = (WirePointer *)&DAT_00000005;
  newVersion._builder.dataSize._0_1_ = newVersion._builder.capTable == (CapTableBuilder *)0x3039;
  if ((!(bool)(undefined1)newVersion._builder.dataSize) && (kj::_::Debug::minSeverity < 3)) {
    local_1f0._0_4_ = 0x3039;
    OrphanBuilder::asStructReader
              ((StructReader *)&_kjCondition_1,&orphan.builder,(StructSize)0x30002);
    if ((uint)_kjCondition_1.op.content.ptr < 0x40) {
      local_1a8.segment = (SegmentBuilder *)0x0;
    }
    else {
      local_1a8.segment = *(SegmentBuilder **)_kjCondition_1.right.content.ptr;
    }
    kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x347,ERROR,
               "\"failed: expected \" \"(12345) == (orphan.getReader().getOld1())\", _kjCondition, 12345, orphan.getReader().getOld1()"
               ,(char (*) [59])"failed: expected (12345) == (orphan.getReader().getOld1())",
               (DebugComparison<int,_long> *)&newVersion,(int *)&local_1f0,(long *)&local_1a8);
  }
  local_1f0._0_8_ = "foo";
  newVersion._builder.segment = old._builder.segment;
  newVersion._builder.capTable = old._builder.capTable;
  newVersion._builder.data = old._builder.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1a8,(PointerBuilder *)&newVersion,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&_kjCondition_1,(DebugExpression<char_const(&)[4]> *)&local_1f0,(Builder *)&local_1a8);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    newVersion._builder.segment = old._builder.segment;
    newVersion._builder.capTable = old._builder.capTable;
    newVersion._builder.data = old._builder.pointers;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1a8,(PointerBuilder *)&newVersion,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[44],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x348,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (old.getOld2())\", _kjCondition, \"foo\", old.getOld2()"
               ,(char (*) [44])"failed: expected (\"foo\") == (old.getOld2())",&_kjCondition_1,
               (char (*) [4])"foo",(Builder *)&local_1a8);
  }
  OrphanBuilder::asStruct(&newVersion._builder,&orphan.builder,(StructSize)0x30002);
  _kjCondition_1.right._0_8_ = *old._builder.data;
  _kjCondition_1.left = (char (*) [4])((ulong)_kjCondition_1.left & 0xffffffff00000000);
  _kjCondition_1.right.content.ptr = " == ";
  _kjCondition_1.right.content.size_ = 5;
  _kjCondition_1.op.content.ptr._0_1_ = _kjCondition_1.right._0_8_ == 0;
  if ((_kjCondition_1.right._0_8_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffff00000000;
    local_1a8.segment = *old._builder.data;
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x34d,ERROR,
               "\"failed: expected \" \"(0) == (old.getOld1())\", _kjCondition, 0, old.getOld1()",
               (char (*) [40])"failed: expected (0) == (old.getOld1())",
               (DebugComparison<int,_long> *)&_kjCondition_1,(int *)&local_1f0,(long *)&local_1a8);
  }
  local_1d8 = "";
  local_1a8.segment = old._builder.segment;
  local_1a8.capTable = old._builder.capTable;
  local_1a8.pointer = old._builder.pointers;
  PointerBuilder::getBlob<capnp::Text>(&local_1f0,&local_1a8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[1]> *)&local_1d8,&local_1f0);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1a8.segment = old._builder.segment;
    local_1a8.capTable = old._builder.capTable;
    local_1a8.pointer = old._builder.pointers;
    PointerBuilder::getBlob<capnp::Text>(&local_1f0,&local_1a8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[41],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x34e,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (old.getOld2())\", _kjCondition, \"\", old.getOld2()"
               ,(char (*) [41])"failed: expected (\"\") == (old.getOld2())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition_1,
               (char (*) [1])0x308a6f,&local_1f0);
  }
  _kjCondition_1.right._0_8_ = *newVersion._builder.data;
  _kjCondition_1.left = (char (*) [4])CONCAT44(_kjCondition_1.left._4_4_,0x3039);
  _kjCondition_1.right.content.ptr = " == ";
  _kjCondition_1.right.content.size_ = 5;
  _kjCondition_1.op.content.ptr._0_1_ = _kjCondition_1.right._0_8_ == 0x3039;
  if ((_kjCondition_1.right._0_8_ != 0x3039) && (kj::_::Debug::minSeverity < 3)) {
    local_1f0._0_4_ = 0x3039;
    local_1a8.segment = *newVersion._builder.data;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x350,ERROR,
               "\"failed: expected \" \"(12345) == (newVersion.getOld1())\", _kjCondition, 12345, newVersion.getOld1()"
               ,(char (*) [51])"failed: expected (12345) == (newVersion.getOld1())",
               (DebugComparison<int,_long> *)&_kjCondition_1,(int *)&local_1f0,(long *)&local_1a8);
  }
  local_1d8 = "foo";
  local_1a8.segment = newVersion._builder.segment;
  local_1a8.capTable = newVersion._builder.capTable;
  local_1a8.pointer = newVersion._builder.pointers;
  PointerBuilder::getBlob<capnp::Text>(&local_1f0,&local_1a8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&_kjCondition_1,(DebugExpression<char_const(&)[4]> *)&local_1d8,&local_1f0);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_1a8.segment = newVersion._builder.segment;
    local_1a8.capTable = newVersion._builder.capTable;
    local_1a8.pointer = newVersion._builder.pointers;
    PointerBuilder::getBlob<capnp::Text>(&local_1f0,&local_1a8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x351,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (newVersion.getOld2())\", _kjCondition, \"foo\", newVersion.getOld2()"
               ,(char (*) [51])"failed: expected (\"foo\") == (newVersion.getOld2())",
               &_kjCondition_1,(char (*) [4])"foo",&local_1f0);
  }
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, UpgradeStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  auto old = root.getAnyPointerField().initAs<test::TestOldVersion>();
  old.setOld1(1234);
  old.setOld2("foo");

  auto orphan = root.getAnyPointerField().disownAs<test::TestNewVersion>();

  // Relocation has not occurred yet.
  old.setOld1(12345);
  EXPECT_EQ(12345, orphan.getReader().getOld1());
  EXPECT_EQ("foo", old.getOld2());

  // This will relocate the struct.
  auto newVersion = orphan.get();

  EXPECT_EQ(0, old.getOld1());
  EXPECT_EQ("", old.getOld2());

  EXPECT_EQ(12345, newVersion.getOld1());
  EXPECT_EQ("foo", newVersion.getOld2());
}